

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

uint __thiscall CaDiCaL::heap<CaDiCaL::elim_more>::pop_front(heap<CaDiCaL::elim_more> *this)

{
  reference pvVar1;
  size_t sVar2;
  char *pcVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  heap<CaDiCaL::elim_more> *in_RDI;
  heap<CaDiCaL::elim_more> *unaff_retaddr;
  uint last;
  uint res;
  undefined4 in_stack_fffffffffffffff0;
  value_type vVar4;
  heap<CaDiCaL::elim_more> *phVar5;
  uint e;
  
  phVar5 = in_RDI;
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&in_RDI->array,0);
  e = (uint)((ulong)phVar5 >> 0x20);
  vVar4 = *pvVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(vVar4,in_stack_fffffffffffffff0));
  sVar2 = size((heap<CaDiCaL::elim_more> *)0xd923e9);
  __c = extraout_EDX;
  if (1 < sVar2) {
    exchange(this,res,last);
    __c = extraout_EDX_00;
  }
  pcVar3 = index(in_RDI,(char *)(ulong)vVar4,__c);
  pcVar3[0] = -1;
  pcVar3[1] = -1;
  pcVar3[2] = -1;
  pcVar3[3] = -1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xd9241c);
  sVar2 = size((heap<CaDiCaL::elim_more> *)0xd92425);
  if (1 < sVar2) {
    down(unaff_retaddr,e);
  }
  check(in_RDI);
  return vVar4;
}

Assistant:

unsigned pop_front () {
    assert (!empty ());
    unsigned res = array[0], last = array.back ();
    if (size () > 1)
      exchange (res, last);
    index (res) = invalid_heap_position;
    array.pop_back ();
    if (size () > 1)
      down (last);
    check ();
    return res;
  }